

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_copy_constructor_equals_self_Test::
ByteBufferTest_test_copy_constructor_equals_self_Test
          (ByteBufferTest_test_copy_constructor_equals_self_Test *this)

{
  ByteBufferTest_test_copy_constructor_equals_self_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ByteBufferTest_test_copy_constructor_equals_self_Test_003d0870;
  return;
}

Assistant:

TEST(ByteBufferTest, test_copy_constructor_equals_self)
{
    ByteBuffer a(5);
    a.WriteByte(5);
    a.WriteByte(7);
    a.WriteByte(9);
    a.WriteByte(11);
    a.ReadByte(); //Shift the read index away from 0
    ByteBuffer b(a);
    EXPECT_EQ(a, b);
    EXPECT_EQ(3, b.ReadableBytes());
    EXPECT_EQ(7, b.ReadByte());
}